

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resizeResolveLabel(Parse *p,Vdbe *v,int j)

{
  int iVar1;
  int *piVar2;
  int nNewSize;
  int j_local;
  Vdbe *v_local;
  Parse *p_local;
  
  iVar1 = 10 - p->nLabel;
  piVar2 = (int *)sqlite3DbReallocOrFree(p->db,p->aLabel,(long)iVar1 << 2);
  p->aLabel = piVar2;
  if (p->aLabel == (int *)0x0) {
    p->nLabelAlloc = 0;
  }
  else {
    p->nLabelAlloc = iVar1;
    p->aLabel[j] = v->nOp;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void resizeResolveLabel(Parse *p, Vdbe *v, int j){
  int nNewSize = 10 - p->nLabel;
  p->aLabel = sqlite3DbReallocOrFree(p->db, p->aLabel,
                     nNewSize*sizeof(p->aLabel[0]));
  if( p->aLabel==0 ){
    p->nLabelAlloc = 0;
  }else{
#ifdef SQLITE_DEBUG
    int i;
    for(i=p->nLabelAlloc; i<nNewSize; i++) p->aLabel[i] = -1;
#endif
    p->nLabelAlloc = nNewSize;
    p->aLabel[j] = v->nOp;
  }
}